

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_manager.cc
# Opt level: O0

RC __thiscall RM_Manager::DestroyFile(RM_Manager *this,char *fileName)

{
  RC rc;
  char *fileName_local;
  RM_Manager *this_local;
  
  if (fileName == (char *)0x0) {
    this_local._4_4_ = 0x6f;
  }
  else {
    this_local._4_4_ = PF_Manager::DestroyFile(this->pfm,fileName);
    if (this_local._4_4_ == 0) {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

RC RM_Manager::DestroyFile(const char *fileName) {
  if(fileName == NULL)
    return (RM_BADFILENAME);
  RC rc;
  if((rc = pfm.DestroyFile(fileName)))
    return (rc);
  return (0); 
}